

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_texture_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Instruction *i,bool sparse,bool *forward
          ,SmallVector<unsigned_int,_8UL> *inherited_expressions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  uint *puVar3;
  SmallVector<unsigned_int,_8UL> *pSVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t *puVar8;
  SPIRType *pSVar9;
  SPIRType *pSVar10;
  SPIRVariable *pSVar11;
  MSLConstexprSampler *pMVar12;
  long *plVar13;
  undefined8 *puVar14;
  runtime_error *prVar15;
  undefined7 in_register_00000009;
  long *plVar16;
  size_type *psVar17;
  ushort uVar18;
  uint32_t id;
  char (*ts_2) [2];
  long lVar19;
  string *expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string inner_expr;
  string local_e8;
  long *local_c8;
  ulong local_c0;
  long local_b8;
  long lStack_b0;
  SmallVector<unsigned_int,_8UL> *local_a8;
  string local_a0;
  uint local_80;
  undefined4 local_7c;
  string local_78;
  SPIRType *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  SPIRType *local_48;
  ulong local_40;
  char (*local_38) [2];
  
  local_7c = (undefined4)CONCAT71(in_register_00000009,sparse);
  local_a8 = inherited_expressions;
  local_38 = (char (*) [2])forward;
  puVar8 = Compiler::stream((Compiler *)this,i);
  local_40 = (ulong)*puVar8;
  uVar7 = puVar8[2];
  pSVar9 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + local_40);
  local_80 = (uint)i->op;
  uVar18 = i->op & 0xfffe;
  pSVar10 = Compiler::expression_type((Compiler *)this,uVar7);
  local_58 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        (pSVar10->super_IVariant).self.id);
  pSVar11 = Compiler::maybe_get_backing_variable((Compiler *)this,uVar7);
  local_48 = pSVar9;
  if (pSVar11 == (SPIRVariable *)0x0) {
    bVar5 = false;
    pMVar12 = (MSLConstexprSampler *)0x0;
  }
  else {
    id = (pSVar11->basevariable).id;
    if (id == 0) {
      id = (pSVar11->super_IVariant).self.id;
    }
    pMVar12 = find_constexpr_sampler(this,id);
    bVar5 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar11->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
  }
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((pMVar12 == (MSLConstexprSampler *)0x0) ||
     (pMVar12->ycbcr_conversion_enable != true || bVar5 != false)) {
    if (((this->msl_options).swizzle_texture_samples != true || uVar18 == 0x60) ||
       (bVar6 = Compiler::is_sampled_image_type((Compiler *)this,local_58), !bVar6 || bVar5 != false
       )) goto LAB_002d7d5a;
    add_spv_func_and_recompile(this,SPVFuncImplTextureSwizzle);
  }
  else {
    switch(pMVar12->ycbcr_model) {
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
      goto switchD_002d7cc2_caseD_0;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT709);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT601);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT2020);
      break;
    default:
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Invalid Y\'CbCr model conversion.","");
      ::std::runtime_error::runtime_error(prVar15,(string *)&local_a0);
      *(undefined ***)prVar15 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
switchD_002d7cc2_caseD_0:
    if (pMVar12->ycbcr_model == MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) goto LAB_002d7d5a;
    if (pMVar12->ycbcr_range == MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW) {
      add_spv_func_and_recompile(this,SPVFuncImplExpandITUNarrowRange);
    }
    else {
      if (pMVar12->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Invalid Y\'CbCr range.","");
        ::std::runtime_error::runtime_error(prVar15,(string *)&local_a0);
        *(undefined ***)prVar15 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      add_spv_func_and_recompile(this,SPVFuncImplExpandITUFullRange);
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_002d7d5a:
  ts_2 = local_38;
  CompilerGLSL::to_texture_op_abi_cxx11_
            (&local_a0,&this->super_CompilerGLSL,i,local_7c._0_1_,(bool *)local_38,local_a8);
  if ((pMVar12 == (MSLConstexprSampler *)0x0) ||
     (pMVar12->ycbcr_conversion_enable != true || bVar5 != false)) {
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
    if (((this->msl_options).swizzle_texture_samples == true && uVar18 != 0x60) &&
       (bVar6 = Compiler::is_sampled_image_type((Compiler *)this,local_58), bVar5 == false && bVar6)
       ) {
      to_swizzle_expression_abi_cxx11_(&local_78,this,uVar7);
      plVar13 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x37aab7);
      plVar16 = plVar13 + 2;
      if ((long *)*plVar13 == plVar16) {
        local_b8 = *plVar16;
        lStack_b0 = plVar13[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar16;
        local_c8 = (long *)*plVar13;
      }
      local_c0 = plVar13[1];
      *plVar13 = (long)plVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_c8);
      psVar17 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_e8.field_2._M_allocated_capacity = *psVar17;
        local_e8.field_2._8_8_ = puVar14[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar17;
        local_e8._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_e8._M_string_length = puVar14[1];
      *puVar14 = psVar17;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      this->used_swizzle_buffer = true;
    }
  }
  else {
    if (((pMVar12->swizzle[0] == MSL_COMPONENT_SWIZZLE_IDENTITY &&
         pMVar12->swizzle[1] == MSL_COMPONENT_SWIZZLE_IDENTITY) &&
         pMVar12->swizzle[2] == MSL_COMPONENT_SWIZZLE_IDENTITY) &&
       (pMVar12->swizzle[3] == MSL_COMPONENT_SWIZZLE_IDENTITY)) {
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
    }
    else if ((pMVar12->swizzle[2] - MSL_COMPONENT_SWIZZLE_ZERO < 2 ||
              (pMVar12->swizzle[1] - MSL_COMPONENT_SWIZZLE_ZERO < 2 ||
              pMVar12->swizzle[0] - MSL_COMPONENT_SWIZZLE_ZERO < 2)) ||
            (pMVar12->swizzle[3] - MSL_COMPONENT_SWIZZLE_ZERO < 2)) {
      uVar7 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      ts_2 = (char (*) [2])0x0;
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,(uint32_t)local_40,uVar7,&local_a0,false,false);
      sVar2 = (local_a8->super_VectorView<unsigned_int>).buffer_size;
      if (sVar2 != 0) {
        puVar3 = (local_a8->super_VectorView<unsigned_int>).ptr;
        lVar19 = 0;
        do {
          Compiler::inherit_expression_dependencies
                    ((Compiler *)this,uVar7,*(uint32_t *)((long)puVar3 + lVar19));
          lVar19 = lVar19 + 4;
        } while (sVar2 << 2 != lVar19);
      }
      pSVar4 = local_a8;
      (local_a8->super_VectorView<unsigned_int>).buffer_size = 0;
      SmallVector<unsigned_int,_8UL>::reserve(local_a8,1);
      sVar2 = (pSVar4->super_VectorView<unsigned_int>).buffer_size;
      (pSVar4->super_VectorView<unsigned_int>).ptr[sVar2] = uVar7;
      (pSVar4->super_VectorView<unsigned_int>).buffer_size = sVar2 + 1;
      if ((local_80 - 0x57 < 7) && ((0x55U >> (local_80 - 0x57 & 0x1f) & 1) != 0)) {
        CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,uVar7);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c8,this,local_48,0);
      plVar13 = (long *)::std::__cxx11::string::append((char *)&local_c8);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar17 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_e8.field_2._M_allocated_capacity = *psVar17;
        local_e8.field_2._8_8_ = plVar13[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar17;
        local_e8._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_e8._M_string_length = plVar13[1];
      *plVar13 = (long)psVar17;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      lVar19 = 0;
      do {
        switch(pMVar12->swizzle[lVar19]) {
        case MSL_COMPONENT_SWIZZLE_IDENTITY:
          CompilerGLSL::to_expression_abi_cxx11_(&local_78,&this->super_CompilerGLSL,uVar7,true);
          puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_78);
          local_c8 = &local_b8;
          plVar13 = puVar14 + 2;
          if ((long *)*puVar14 == plVar13) {
            local_b8 = *plVar13;
            lStack_b0 = puVar14[3];
          }
          else {
            local_b8 = *plVar13;
            local_c8 = (long *)*puVar14;
          }
          local_c0 = puVar14[1];
          *puVar14 = plVar13;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          ts_2 = (char (*) [2])(ulong)(uint)(int)"rgba"[lVar19];
          puVar14 = (undefined8 *)
                    ::std::__cxx11::string::_M_replace_aux((ulong)&local_c8,local_c0,0,'\x01');
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar17 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_e8.field_2._M_allocated_capacity = *psVar17;
            local_e8.field_2._8_8_ = puVar14[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar17;
            local_e8._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_e8._M_string_length = puVar14[1];
          *puVar14 = psVar17;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          break;
        case MSL_COMPONENT_SWIZZLE_ZERO:
        case MSL_COMPONENT_SWIZZLE_ONE:
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          goto LAB_002d814b;
        case MSL_COMPONENT_SWIZZLE_R:
        case MSL_COMPONENT_SWIZZLE_G:
        case MSL_COMPONENT_SWIZZLE_B:
        case MSL_COMPONENT_SWIZZLE_A:
          CompilerGLSL::to_expression_abi_cxx11_(&local_78,&this->super_CompilerGLSL,uVar7,true);
          puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_78);
          local_c8 = &local_b8;
          plVar13 = puVar14 + 2;
          if ((long *)*puVar14 == plVar13) {
            local_b8 = *plVar13;
            lStack_b0 = puVar14[3];
          }
          else {
            local_b8 = *plVar13;
            local_c8 = (long *)*puVar14;
          }
          local_c0 = puVar14[1];
          *puVar14 = plVar13;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          ts_2 = (char (*) [2])
                 (ulong)(uint)(int)"spvTextureSwizzle("[(long)(int)pMVar12->swizzle[lVar19] + 0x10];
          puVar14 = (undefined8 *)
                    ::std::__cxx11::string::_M_replace_aux((ulong)&local_c8,local_c0,0,'\x01');
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar17 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_e8.field_2._M_allocated_capacity = *psVar17;
            local_e8.field_2._8_8_ = puVar14[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar17;
            local_e8._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_e8._M_string_length = puVar14[1];
          *puVar14 = psVar17;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          break;
        default:
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"Invalid component swizzle.","");
          ::std::runtime_error::runtime_error(prVar15,(string *)&local_e8);
          *(undefined ***)prVar15 = &PTR__runtime_error_003fce08;
          __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
LAB_002d814b:
        if (lVar19 != 3) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      paVar1 = &local_e8.field_2;
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_a0._M_dataplus._M_p,
                 local_a0._M_dataplus._M_p + local_a0._M_string_length);
      ::std::__cxx11::string::append((char *)&local_e8);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      lVar19 = 0;
      do {
        if ((3 < pMVar12->swizzle[lVar19] - MSL_COMPONENT_SWIZZLE_R) &&
           (pMVar12->swizzle[lVar19] != MSL_COMPONENT_SWIZZLE_IDENTITY)) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_e8._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"Invalid component swizzle.","");
          ::std::runtime_error::runtime_error(prVar15,(string *)&local_e8);
          *(undefined ***)prVar15 = &PTR__runtime_error_003fce08;
          __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
    }
    if (pMVar12->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) {
      join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (&local_e8,(spirv_cross *)0x37aab7,(char (*) [3])&pMVar12->bpc,(uint *)0x36641e,ts_2
                );
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (pMVar12->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_texture_op(const Instruction &i, bool sparse, bool *forward,
                                  SmallVector<uint32_t> &inherited_expressions)
{
	auto *ops = stream(i);
	uint32_t result_type_id = ops[0];
	uint32_t img = ops[2];
	auto &result_type = get<SPIRType>(result_type_id);
	auto op = static_cast<Op>(i.op);
	bool is_gather = (op == OpImageGather || op == OpImageDrefGather);

	// Bypass pointers because we need the real image struct
	auto &type = expression_type(img);
	auto &imgtype = get<SPIRType>(type.self);

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	string expr;
	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		// If this needs sampler Y'CbCr conversion, we need to do some additional
		// processing.
		switch (constexpr_sampler->ycbcr_model)
		{
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
			// Default
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT709);
			expr += "spvConvertYCbCrBT709(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT601);
			expr += "spvConvertYCbCrBT601(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT2020);
			expr += "spvConvertYCbCrBT2020(";
			break;
		default:
			SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
		}

		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			switch (constexpr_sampler->ycbcr_range)
			{
			case MSL_SAMPLER_YCBCR_RANGE_ITU_FULL:
				add_spv_func_and_recompile(SPVFuncImplExpandITUFullRange);
				expr += "spvExpandITUFullRange(";
				break;
			case MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW:
				add_spv_func_and_recompile(SPVFuncImplExpandITUNarrowRange);
				expr += "spvExpandITUNarrowRange(";
				break;
			default:
				SPIRV_CROSS_THROW("Invalid Y'CbCr range.");
			}
		}
	}
	else if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
	         !is_dynamic_img_sampler)
	{
		add_spv_func_and_recompile(SPVFuncImplTextureSwizzle);
		expr += "spvTextureSwizzle(";
	}

	string inner_expr = CompilerGLSL::to_texture_op(i, sparse, forward, inherited_expressions);

	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		if (!constexpr_sampler->swizzle_is_identity())
		{
			static const char swizzle_names[] = "rgba";
			if (!constexpr_sampler->swizzle_has_one_or_zero())
			{
				// If we can, do it inline.
				expr += inner_expr + ".";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
				}
			}
			else
			{
				// Otherwise, we need to emit a temporary and swizzle that.
				uint32_t temp_id = ir.increase_bound_by(1);
				emit_op(result_type_id, temp_id, inner_expr, false);
				for (auto &inherit : inherited_expressions)
					inherit_expression_dependencies(temp_id, inherit);
				inherited_expressions.clear();
				inherited_expressions.push_back(temp_id);

				switch (op)
				{
				case OpImageSampleDrefImplicitLod:
				case OpImageSampleImplicitLod:
				case OpImageSampleProjImplicitLod:
				case OpImageSampleProjDrefImplicitLod:
					register_control_dependent_expression(temp_id);
					break;

				default:
					break;
				}
				expr += type_to_glsl(result_type) + "(";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += to_expression(temp_id) + "." + swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_ZERO:
						expr += "0";
						break;
					case MSL_COMPONENT_SWIZZLE_ONE:
						expr += "1";
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += to_expression(temp_id) + "." +
						        swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
					if (c < 3)
						expr += ", ";
				}
				expr += ")";
			}
		}
		else
			expr += inner_expr;
		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			expr += join(", ", constexpr_sampler->bpc, ")");
			if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY)
				expr += ")";
		}
	}
	else
	{
		expr += inner_expr;
		if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
		    !is_dynamic_img_sampler)
		{
			// Add the swizzle constant from the swizzle buffer.
			expr += ", " + to_swizzle_expression(img) + ")";
			used_swizzle_buffer = true;
		}
	}

	return expr;
}